

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setActionGroup(QAction *this,QActionGroup *group)

{
  long lVar1;
  bool bVar2;
  QActionPrivate *this_00;
  long in_RSI;
  QActionPrivate *in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *d;
  QActionGroup *in_stack_00000038;
  QActionGroup *in_stack_00000040;
  QAction *in_stack_00000048;
  QAction *in_stack_00000088;
  QActionPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QAction *)0x975d2e);
  bVar2 = ::operator==((QActionGroup **)this_00,(QPointer<QActionGroup> *)in_RDI);
  if (!bVar2) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QActionGroup> *)0x975d5c);
    if (bVar2) {
      QPointer<QActionGroup>::operator->((QPointer<QActionGroup> *)0x975d70);
      QActionGroup::removeAction(in_stack_00000040,in_stack_00000048);
    }
    QPointer<QActionGroup>::operator=((QPointer<QActionGroup> *)this_00,(QActionGroup *)in_RDI);
    if (in_RSI != 0) {
      QActionGroup::addAction(in_stack_00000038,in_stack_00000088);
    }
    QActionPrivate::sendDataChanged(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAction::setActionGroup(QActionGroup *group)
{
    Q_D(QAction);
    if (group == d->group)
        return;

    if (d->group)
        d->group->removeAction(this);
    d->group = group;
    if (group)
        group->addAction(this);
    d->sendDataChanged();
}